

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O1

vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *
rcdiscover::SocketLinux::createAndBindForAllInterfaces
          (vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
           *__return_storage_ptr__,uint16_t port)

{
  undefined4 uVar1;
  in_addr_t iVar2;
  long lVar3;
  long *plVar4;
  undefined2 uVar5;
  int iVar6;
  socklen_t address_length;
  string name;
  sockaddr_in addr;
  ifaddrs *addrs;
  socklen_t local_f4;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  SocketLinux local_70;
  long *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getifaddrs(&local_38);
  for (plVar4 = local_38; plVar4 != (long *)0x0; plVar4 = (long *)*plVar4) {
    if (((((*(byte *)(plVar4 + 2) & 1) != 0) && (plVar4[1] != 0)) &&
        ((short *)plVar4[3] != (short *)0x0)) &&
       (lVar3 = plVar4[5], lVar3 != 0 && *(short *)plVar4[3] == 2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(char *)plVar4[1],(allocator<char> *)&local_70);
      if ((local_e8 != 0) && (iVar6 = std::__cxx11::string::compare((char *)&local_f0), iVar6 != 0))
      {
        uVar1 = *(undefined4 *)(plVar4[3] + 4);
        getBroadcastAddr();
        iVar2 = getBroadcastAddr::bcast;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_f0,local_e8 + (long)local_f0);
        create(&local_70,iVar2,port,&local_90);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>(__return_storage_ptr__,&local_70);
        ~SocketLinux(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._0_4_ = 2;
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._4_4_ = uVar1;
        bindImpl((__return_storage_ptr__->
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,(sockaddr_in *)&local_70);
        local_f4 = 0x10;
        getsockname((__return_storage_ptr__->
                    super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].sock_,(sockaddr *)&local_70,
                    &local_f4);
        uVar5 = local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._2_2_;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_f0,local_e8 + (long)local_f0);
        create(&local_70,0,port,&local_b0);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>(__return_storage_ptr__,&local_70);
        ~SocketLinux(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._0_4_ =
             CONCAT22(uVar5,2);
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._4_4_ = 0;
        bindImpl((__return_storage_ptr__->
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,(sockaddr_in *)&local_70);
        iVar2 = *(in_addr_t *)(lVar3 + 4);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_f0,local_e8 + (long)local_f0);
        create(&local_70,iVar2,port,&local_d0);
        std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
        emplace_back<rcdiscover::SocketLinux>(__return_storage_ptr__,&local_70);
        ~SocketLinux(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._0_4_ =
             CONCAT22(uVar5,2);
        local_70.super_Socket<rcdiscover::SocketLinux>.iface_name_._M_dataplus._M_p._4_4_ = 0;
        bindImpl((__return_storage_ptr__->
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,(sockaddr_in *)&local_70);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
    }
  }
  freeifaddrs(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SocketLinux> SocketLinux::createAndBindForAllInterfaces(
    const uint16_t port)
{
  std::vector<SocketLinux> sockets;

  ifaddrs *addrs;
  getifaddrs(&addrs);

  int i = 0;

  for(ifaddrs *addr = addrs;
      addr != nullptr;
      addr = addr->ifa_next)
  {
    auto baddr = addr->ifa_ifu.ifu_broadaddr;
    if (addr->ifa_flags & IFF_UP &&
        addr->ifa_name != nullptr &&
        addr->ifa_addr != nullptr &&
        addr->ifa_addr->sa_family == AF_INET &&
        baddr != nullptr)
    {
      std::string name(addr->ifa_name);
      if (name.length() != 0 && name != "lo")
      {
        const in_addr_t s_addr =
            reinterpret_cast<struct sockaddr_in *>(addr->ifa_addr)->
            sin_addr.s_addr;

        uint16_t local_port = 0;

        {
          // limited broadcast
          sockets.emplace_back(SocketLinux::create(getBroadcastAddr(), port, name));

          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = 0;
          addr.sin_addr.s_addr = s_addr;
          sockets.back().bind(addr);
        }

        {
          // get port to which the limited broadcast socket is bound to
          struct sockaddr_in local_address;
          socklen_t address_length = sizeof(local_address);
          getsockname(sockets.back().sock_,
                      reinterpret_cast<sockaddr *>(&local_address),
                      &address_length);
          local_port = local_address.sin_port;
        }

        {
          // limited broadcast receiver
          sockets.emplace_back(SocketLinux::create(htonl(INADDR_ANY), port, name));

          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = local_port;
          addr.sin_addr.s_addr = htonl(INADDR_ANY);
          sockets.back().bind(addr);
        }

        {
          // directed broadcast
          sockets.emplace_back(
                SocketLinux::create(
                  reinterpret_cast<struct sockaddr_in *>(baddr)->
                  sin_addr.s_addr, port, name));
          sockaddr_in addr;
          addr.sin_family = AF_INET;
          addr.sin_port = local_port;
          addr.sin_addr.s_addr = htonl(INADDR_ANY);
          sockets.back().bind(addr);
        }
      }
    }

    ++i;
  }

  freeifaddrs(addrs);
  addrs = nullptr;

  return sockets;
}